

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::ReportLastSystemError(char *msg)

{
  string m;
  long *local_48 [2];
  long local_38 [2];
  long *local_28 [2];
  long local_18 [2];
  
  std::__cxx11::string::string((string *)local_28,msg,(allocator *)local_48);
  std::__cxx11::string::append((char *)local_28);
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::string::_M_append((char *)local_28,(ulong)local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  Error((char *)local_28[0],(char *)0x0,(char *)0x0,(char *)0x0);
  if (local_28[0] != local_18) {
    operator_delete(local_28[0],local_18[0] + 1);
  }
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m = msg;
  m += ": System Error: ";
  m += Superclass::GetLastSystemError();
  cmSystemTools::Error(m.c_str());
}